

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpivotL.c
# Opt level: O1

int dpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  flops_t *pfVar6;
  void *pvVar7;
  int_t *piVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  
  pfVar6 = stat->ops;
  pvVar7 = Glu->lusup;
  iVar9 = Glu->xsup[Glu->supno[jcol]];
  iVar2 = Glu->xlsub[iVar9];
  iVar14 = Glu->xlsub[(long)iVar9 + 1] - iVar2;
  iVar3 = Glu->xlusup[iVar9];
  iVar4 = Glu->xlusup[jcol];
  piVar8 = Glu->lsub;
  uVar11 = jcol - iVar9;
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  uVar16 = 0xffffffff;
  uVar12 = 0xffffffff;
  dVar19 = 0.0;
  uVar17 = uVar11;
  uVar15 = uVar11;
  if (iVar14 - uVar11 != 0 && (int)uVar11 <= iVar14) {
    uVar10 = (ulong)(int)uVar11;
    dVar20 = 0.0;
    uVar18 = uVar11;
    do {
      dVar19 = ABS(*(double *)((long)pvVar7 + uVar10 * 8 + (long)iVar4 * 8));
      uVar12 = (uint)uVar10;
      if (dVar20 < dVar19) {
        uVar15 = uVar12;
      }
      if ((*usepr != 0) && (uVar17 = uVar18, piVar8[(long)iVar2 + uVar10] == *pivrow)) {
        uVar17 = uVar12;
        uVar18 = uVar12;
      }
      if (piVar8[(long)iVar2 + uVar10] == iperm_c[jcol]) {
        uVar16 = uVar10 & 0xffffffff;
      }
      uVar12 = (uint)uVar16;
      if (dVar19 <= dVar20) {
        dVar19 = dVar20;
      }
      uVar10 = uVar10 + 1;
      dVar20 = dVar19;
    } while ((long)uVar10 < (long)iVar14);
  }
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    uVar18 = uVar15;
    if (*usepr != 0) {
      dVar20 = *(double *)((long)pvVar7 + (long)(int)uVar17 * 8 + (long)iVar4 * 8);
      if (((dVar20 == 0.0) && (!NAN(dVar20))) || (uVar18 = uVar17, ABS(dVar20) < dVar19 * u)) {
        *usepr = 0;
        uVar18 = uVar15;
      }
    }
    if (*usepr == 0) {
      if (-1 < (int)uVar12) {
        dVar20 = *(double *)((long)pvVar7 + (ulong)uVar12 * 8 + (long)iVar4 * 8);
        if (ABS(dVar20) < dVar19 * u) {
          uVar12 = uVar18;
        }
        if (dVar20 != 0.0) {
          uVar18 = uVar12;
        }
        if (NAN(dVar20)) {
          uVar18 = uVar12;
        }
      }
      *pivrow = piVar8[(long)iVar2 + (long)(int)uVar18];
    }
    perm_r[*pivrow] = jcol;
    lVar13 = (long)(int)uVar11;
    if (uVar18 != uVar11) {
      iVar5 = piVar8[(long)iVar2 + (long)(int)uVar18];
      piVar8[(long)iVar2 + (long)(int)uVar18] = piVar8[iVar2 + lVar13];
      piVar8[iVar2 + lVar13] = iVar5;
      if (-1 < (int)uVar11) {
        uVar16 = (ulong)((jcol - iVar9) + 1);
        uVar12 = uVar11;
        do {
          uVar1 = *(undefined8 *)((long)pvVar7 + (long)(int)uVar18 * 8 + (long)iVar3 * 8);
          *(undefined8 *)((long)pvVar7 + (long)(int)uVar18 * 8 + (long)iVar3 * 8) =
               *(undefined8 *)((long)pvVar7 + (long)(int)uVar12 * 8 + (long)iVar3 * 8);
          *(undefined8 *)((long)pvVar7 + (long)(int)uVar12 * 8 + (long)iVar3 * 8) = uVar1;
          uVar12 = uVar12 + iVar14;
          uVar18 = uVar18 + iVar14;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
    }
    pfVar6[7] = (float)(int)(iVar14 - uVar11) + pfVar6[7];
    iVar9 = 0;
    if ((int)(uVar11 + 1) < iVar14) {
      dVar19 = *(double *)((long)pvVar7 + lVar13 * 8 + (long)iVar4 * 8);
      lVar13 = (long)(int)(uVar11 + 1);
      do {
        *(double *)((long)pvVar7 + lVar13 * 8 + (long)iVar4 * 8) =
             *(double *)((long)pvVar7 + lVar13 * 8 + (long)iVar4 * 8) * (1.0 / dVar19);
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar14);
    }
  }
  else {
    *usepr = 0;
    iVar9 = jcol + 1;
  }
  return iVar9;
}

Assistant:

int
dpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    double       temp;
    double       *lu_sup_ptr; 
    double       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
	rtemp = fabs (lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = fabs (lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
	    rtemp = fabs (lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += nsupr - nsupc;

    temp = 1.0 / lu_col_ptr[nsupc];
    for (k = nsupc+1; k < nsupr; k++) 
	lu_col_ptr[k] *= temp;

    return 0;
}